

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O0

int HandleEvent(SDL_Event *event)

{
  Uint8 UVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint local_14;
  int done;
  SDL_Event *event_local;
  
  local_14 = 0;
  UVar1 = event->type;
  if (UVar1 == '\x01') {
    pcVar3 = "lost";
    if ((event->active).gain != '\0') {
      pcVar3 = "gained";
    }
    printf("app %s ",pcVar3);
    if (((event->active).state & 4) == 0) {
      if (((event->active).state & 1) == 0) {
        if (((event->active).state & 2) != 0) {
          printf("input ");
        }
      }
      else {
        printf("mouse ");
      }
    }
    else {
      printf("active ");
    }
    printf("focus\n");
  }
  else if (UVar1 == '\x02') {
    local_14 = (uint)((event->resize).h == 0x1b);
    if (((event->resize).h == 0x67) &&
       (((event->key).keysym.mod & (KMOD_RCTRL|KMOD_LCTRL)) != KMOD_NONE)) {
      HotKey_ToggleGrab();
    }
    if (((event->resize).h == 0x7a) &&
       (((event->key).keysym.mod & (KMOD_RCTRL|KMOD_LCTRL)) != KMOD_NONE)) {
      HotKey_Iconify();
    }
    if (((event->resize).h == 0xd) &&
       (((event->key).keysym.mod & (KMOD_RALT|KMOD_LALT)) != KMOD_NONE)) {
      HotKey_ToggleFullScreen();
    }
    uVar2 = SDL_GetKeyName((event->resize).h);
    printf("key \'%s\' pressed\n",uVar2);
  }
  else if (UVar1 == '\f') {
    local_14 = 1;
  }
  return local_14;
}

Assistant:

int HandleEvent(SDL_Event *event)
{
	int done;

	done = 0;
	switch( event->type ) {
	    case SDL_ACTIVEEVENT:
		/* See what happened */
		printf( "app %s ", event->active.gain ? "gained" : "lost" );
		if ( event->active.state & SDL_APPACTIVE ) {
			printf( "active " );
		} else if ( event->active.state & SDL_APPMOUSEFOCUS ) {
			printf( "mouse " );
		} else if ( event->active.state & SDL_APPINPUTFOCUS ) {
			printf( "input " );
		}
		printf( "focus\n" );
		break;
		

	    case SDL_KEYDOWN:
		if ( event->key.keysym.sym == SDLK_ESCAPE ) {
			done = 1;
		}
		if ( (event->key.keysym.sym == SDLK_g) &&
		     (event->key.keysym.mod & KMOD_CTRL) ) {
			HotKey_ToggleGrab();
		}
		if ( (event->key.keysym.sym == SDLK_z) &&
		     (event->key.keysym.mod & KMOD_CTRL) ) {
			HotKey_Iconify();
		}
		if ( (event->key.keysym.sym == SDLK_RETURN) &&
		     (event->key.keysym.mod & KMOD_ALT) ) {
			HotKey_ToggleFullScreen();
		}
		printf("key '%s' pressed\n", 
			SDL_GetKeyName(event->key.keysym.sym));
		break;
	    case SDL_QUIT:
		done = 1;
		break;
	}
	return(done);
}